

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_187f987::TLL::HandleLibrary
          (TLL *this,ProcessingState currentProcessingState,string *lib,cmTargetLinkLibraryType llt)

{
  uint uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *pcVar3;
  cmTargetLinkLibraryType llt_00;
  bool bVar4;
  TargetType TVar5;
  PolicyStatus PVar6;
  cmListFileContext *lfc;
  string *psVar7;
  ostream *poVar8;
  size_t sVar9;
  cmGlobalGenerator *this_00;
  cmTarget *pcVar10;
  size_type sVar11;
  undefined8 *puVar12;
  cmake *this_01;
  cmValue cVar13;
  undefined8 *puVar14;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID id;
  PolicyID extraout_EDX_01;
  PolicyID extraout_EDX_02;
  PolicyID id_00;
  string *dc;
  pointer pbVar15;
  char *pcVar16;
  char *__s;
  string *dc_1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  string prop;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  ostringstream e;
  string local_218;
  undefined4 local_1f4;
  string local_1f0;
  undefined8 local_1d0;
  pointer local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  pointer local_188;
  undefined8 local_180;
  size_type local_178;
  char *local_170;
  undefined8 local_168;
  size_type local_160;
  pointer local_158;
  undefined8 local_150;
  size_type local_148;
  char *local_140;
  undefined8 local_138;
  undefined8 local_130;
  char *local_128;
  undefined8 local_120;
  
  TVar5 = cmTarget::GetType(this->Target);
  if ((currentProcessingState == ProcessingKeywordLinkInterface) || (TVar5 != INTERFACE_LIBRARY)) {
    bVar4 = cmTarget::IsImported(this->Target);
    if ((currentProcessingState == ProcessingKeywordLinkInterface) || (!bVar4)) {
      local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,llt);
      pcVar10 = this->Target;
      cmMakefile::GetBacktrace(this->Makefile);
      lfc = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                      ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_1a8);
      uVar1 = currentProcessingState - ProcessingKeywordLinkInterface;
      bVar4 = cmTarget::PushTLLCommandTrace(pcVar10,(uint)(4 < uVar1),lfc);
      id_00 = extraout_EDX;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
        id_00 = extraout_EDX_00;
      }
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        PVar6 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0023,false);
        if (PVar6 - NEW < 3) {
          __s = "must";
          local_1d0 = (pointer)CONCAT44(local_1d0._4_4_,2);
          local_1f4 = (undefined4)CONCAT71((uint7)(uint3)(PVar6 >> 8),1);
LAB_00431c89:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"The ",4);
          pcVar16 = "keyword";
          if (4 >= uVar1) {
            pcVar16 = "plain";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,pcVar16,(ulong)(4 < uVar1) * 2 + 5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     " signature for target_link_libraries has already been used with the target \""
                     ,0x4c);
          psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(psVar7->_M_dataplus)._M_p,
                              psVar7->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\".  All uses of target_link_libraries with a target ",0x34);
          sVar9 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,__s,sVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," be either all-keyword or all-plain.\n",0x25);
          cmTarget::GetTllSignatureTraces(this->Target,(ostream *)local_1a8,(uint)(uVar1 < 5));
          pcVar3 = this->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar3,(MessageType)local_1d0,&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,
                            (ulong)(local_218.field_2._M_allocated_capacity + 1));
          }
          if ((char)local_1f4 != '\0') {
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)&local_138);
            return false;
          }
        }
        else if (PVar6 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_218,(cmPolicies *)0x17,id);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_218._M_dataplus._M_p,
                              local_218._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,
                            (ulong)(local_218.field_2._M_allocated_capacity + 1));
          }
          __s = "should";
          local_1f4 = 0;
          local_1d0 = (pointer)((ulong)local_1d0._4_4_ << 0x20);
          goto LAB_00431c89;
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)&local_138);
        id_00 = extraout_EDX_01;
      }
      llt_00 = (cmTargetLinkLibraryType)local_1c8;
      if (0xfffffffd < currentProcessingState - ProcessingPlainPublicInterface) {
LAB_0043202a:
        if (this->WarnRemoteInterface == true) {
          pcVar3 = this->Makefile;
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f0,(cmPolicies *)0x4f,id_00);
          psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
          local_1a8._0_8_ = local_1f0._M_string_length;
          local_1a8._8_8_ = local_1f0._M_dataplus._M_p;
          local_198._8_8_ = 10;
          local_188 = "\nTarget\n  ";
          local_180 = 0;
          local_170 = (psVar7->_M_dataplus)._M_p;
          local_178 = psVar7->_M_string_length;
          local_168 = 0;
          local_160 = 99;
          local_158 = 
          "\nis not created in this directory.  For compatibility with older versions of CMake, link library\n  "
          ;
          local_150 = 0;
          local_140 = (lib->_M_dataplus)._M_p;
          local_148 = lib->_M_string_length;
          local_138 = 0;
          local_130 = 0x6a;
          local_128 = 
          "\nwill be looked up in the directory in which the target was created rather than in this calling directory."
          ;
          local_120 = 0;
          views_00._M_len = 6;
          views_00._M_array = (iterator)local_1a8;
          local_198._M_allocated_capacity = (size_type)&local_1f0;
          cmCatViews(&local_218,views_00);
          cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,
                            (ulong)(local_218.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
        }
        if (currentProcessingState - ProcessingPlainPrivateInterface < 2) {
          TVar5 = cmTarget::GetType(this->Target);
          if ((TVar5 != STATIC_LIBRARY) &&
             (TVar5 = cmTarget::GetType(this->Target), TVar5 != OBJECT_LIBRARY)) {
            return true;
          }
          cmTarget::GetDebugGeneratorExpressions((string *)local_1a8,this->Target,lib,llt_00);
          bVar4 = cmGeneratorExpression::IsValidTargetName(lib);
          if ((bVar4) || (sVar11 = cmGeneratorExpression::Find(lib), sVar11 != 0xffffffffffffffff))
          {
            std::operator+(&local_1f0,"$<LINK_ONLY:",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8);
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
            puVar14 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar14) {
              local_218.field_2._M_allocated_capacity = *puVar14;
              local_218.field_2._8_8_ = puVar12[3];
              local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
            }
            else {
              local_218.field_2._M_allocated_capacity = *puVar14;
              local_218._M_dataplus._M_p = (pointer)*puVar12;
            }
            local_218._M_string_length = puVar12[1];
            *puVar12 = puVar14;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_218);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p,
                              (ulong)(local_218.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_218,"INTERFACE_LINK_LIBRARIES","");
          AppendProperty(this,&local_218,(string *)local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,
                            (ulong)(local_218.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._0_8_ != &local_198) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._M_allocated_capacity + 1));
          }
          return true;
        }
        local_1a8._0_8_ = &local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"INTERFACE_LINK_LIBRARIES","");
        cmTarget::GetDebugGeneratorExpressions(&local_218,this->Target,lib,llt_00);
        AppendProperty(this,(string *)local_1a8,&local_218);
        paVar2 = &local_218.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar2) {
          operator_delete(local_218._M_dataplus._M_p,
                          (ulong)(local_218.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._M_allocated_capacity + 1));
        }
        if (currentProcessingState == ProcessingLinkLibraries) {
          return true;
        }
        PVar6 = cmTarget::GetPolicyStatus(this->Target,CMP0022);
        if (WARN < PVar6) {
          return true;
        }
        TVar5 = cmTarget::GetType(this->Target);
        if (TVar5 != INTERFACE_LIBRARY) {
          this_01 = cmMakefile::GetCMakeInstance(this->Makefile);
          cmake::GetDebugConfigs_abi_cxx11_(&local_1c0,this_01);
          local_218._M_string_length = 0;
          local_218.field_2._M_allocated_capacity =
               local_218.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_218._M_dataplus._M_p = (pointer)paVar2;
          if ((llt_00 < OPTIMIZED_LibraryType) &&
             (local_1d0 = local_1c0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
             local_1c0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_1c0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) {
            pbVar15 = local_1c0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              local_1a8._0_8_ = &DAT_00000019;
              local_1a8._8_8_ = "LINK_INTERFACE_LIBRARIES_";
              local_198._M_allocated_capacity = 0;
              local_188 = (pbVar15->_M_dataplus)._M_p;
              local_198._8_8_ = pbVar15->_M_string_length;
              local_180 = 0;
              views_01._M_len = 2;
              views_01._M_array = (iterator)local_1a8;
              cmCatViews(&local_1f0,views_01);
              std::__cxx11::string::operator=((string *)&local_218,(string *)&local_1f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p,
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
              AppendProperty(this,&local_218,lib);
              pbVar15 = pbVar15 + 1;
            } while (pbVar15 != local_1d0);
          }
          if (((ulong)local_1c8 & 0xfffffffd) == 0) {
            local_1a8._0_8_ = &local_198;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"LINK_INTERFACE_LIBRARIES","");
            AppendProperty(this,(string *)local_1a8,lib);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._0_8_ != &local_198) {
              operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._M_allocated_capacity + 1));
            }
            local_1c8 = local_1c0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            if (local_1c0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_1c0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              pbVar15 = local_1c0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                local_1a8._0_8_ = &DAT_00000019;
                local_1a8._8_8_ = "LINK_INTERFACE_LIBRARIES_";
                local_198._M_allocated_capacity = 0;
                local_188 = (pbVar15->_M_dataplus)._M_p;
                local_198._8_8_ = pbVar15->_M_string_length;
                local_180 = 0;
                views_02._M_len = 2;
                views_02._M_array = (iterator)local_1a8;
                cmCatViews(&local_1f0,views_02);
                std::__cxx11::string::operator=((string *)&local_218,(string *)&local_1f0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                  operator_delete(local_1f0._M_dataplus._M_p,
                                  local_1f0.field_2._M_allocated_capacity + 1);
                }
                cVar13 = cmTarget::GetProperty(this->Target,&local_218);
                if (cVar13.Value == (string *)0x0) {
                  pcVar10 = this->Target;
                  local_1a8._0_8_ = &local_198;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
                  cmTarget::SetProperty(pcVar10,&local_218,(string *)local_1a8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1a8._0_8_ != &local_198) {
                    operator_delete((void *)local_1a8._0_8_,
                                    (ulong)(local_198._M_allocated_capacity + 1));
                  }
                }
                pbVar15 = pbVar15 + 1;
              } while (pbVar15 != local_1c8);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1c0);
          return true;
        }
        return true;
      }
      pcVar3 = this->Makefile;
      if (this->RejectRemoteLinking != true) {
        this_00 = cmMakefile::GetGlobalGenerator(pcVar3);
        pcVar10 = cmGlobalGenerator::FindTarget(this_00,lib,false);
        if (((((pcVar10 != (cmTarget *)0x0) &&
              (TVar5 = cmTarget::GetType(pcVar10), TVar5 != STATIC_LIBRARY)) &&
             (TVar5 = cmTarget::GetType(pcVar10), TVar5 != SHARED_LIBRARY)) &&
            ((TVar5 = cmTarget::GetType(pcVar10), TVar5 != UNKNOWN_LIBRARY &&
             (TVar5 = cmTarget::GetType(pcVar10), TVar5 != OBJECT_LIBRARY)))) &&
           ((TVar5 = cmTarget::GetType(pcVar10), TVar5 != INTERFACE_LIBRARY &&
            (bVar4 = cmTarget::IsExecutableWithExports(pcVar10), !bVar4)))) {
          pcVar3 = this->Makefile;
          TVar5 = cmTarget::GetType(pcVar10);
          psVar7 = cmState::GetTargetTypeName_abi_cxx11_(TVar5);
          cmStrCat<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[11],std::__cxx11::string_const&,char_const(&)[115],char_const(&)[50]>
                    ((string *)local_1a8,(char (*) [9])0x88e9c0,lib,(char (*) [11])"\" of type ",
                     psVar7,(char (*) [115])
                            " may not be linked into another target. One may link only to INTERFACE, OBJECT, STATIC or SHARED libraries, or to "
                     ,(char (*) [50])0x8b496b);
          cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._0_8_ != &local_198) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._M_allocated_capacity + 1));
          }
        }
        local_1a8._0_8_ = &local_198;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"LINK_LIBRARIES","");
        AffectsProperty(this,(string *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._M_allocated_capacity + 1));
        }
        cmTarget::AddLinkLibrary(this->Target,this->Makefile,lib,llt_00);
        id_00 = extraout_EDX_02;
        goto LAB_0043202a;
      }
      psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
      local_1a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1d;
      local_1a8._8_8_ = "Attempt to add link library \"";
      local_198._M_allocated_capacity = 0;
      local_188 = (lib->_M_dataplus)._M_p;
      local_198._8_8_ = lib->_M_string_length;
      local_180 = 0;
      local_178 = 0xd;
      local_170 = "\" to target \"";
      local_168 = 0;
      local_158 = (psVar7->_M_dataplus)._M_p;
      local_160 = psVar7->_M_string_length;
      local_150 = 0;
      local_148 = 0x5f;
      local_140 = 
      "\" which is not built in this directory.\nThis is allowed only when policy CMP0079 is set to NEW."
      ;
      local_138 = 0;
      views._M_len = 5;
      views._M_array = (iterator)local_1a8;
      cmCatViews(&local_218,views);
      cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p == &local_218.field_2) {
        return false;
      }
      goto LAB_00431b60;
    }
    pcVar3 = this->Makefile;
    local_1a8._0_8_ = &local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "IMPORTED library can only be used with the INTERFACE keyword of target_link_libraries"
               ,"");
    cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_1a8);
  }
  else {
    pcVar3 = this->Makefile;
    local_1a8._0_8_ = &local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "INTERFACE library can only be used with the INTERFACE keyword of target_link_libraries"
               ,"");
    cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_1a8);
  }
  local_218.field_2._M_allocated_capacity = local_198._M_allocated_capacity;
  local_218._M_dataplus._M_p = (pointer)local_1a8._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ == &local_198) {
    return false;
  }
LAB_00431b60:
  operator_delete(local_218._M_dataplus._M_p,
                  (ulong)((long)&(((string *)local_218.field_2._M_allocated_capacity)->_M_dataplus).
                                 _M_p + 1));
  return false;
}

Assistant:

bool TLL::HandleLibrary(ProcessingState currentProcessingState,
                        const std::string& lib, cmTargetLinkLibraryType llt)
{
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY &&
      currentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile.IssueMessage(
      MessageType::FATAL_ERROR,
      "INTERFACE library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }
  if (this->Target->IsImported() &&
      currentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile.IssueMessage(
      MessageType::FATAL_ERROR,
      "IMPORTED library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }

  cmTarget::TLLSignature sig =
    (currentProcessingState == ProcessingPlainPrivateInterface ||
     currentProcessingState == ProcessingPlainPublicInterface ||
     currentProcessingState == ProcessingKeywordPrivateInterface ||
     currentProcessingState == ProcessingKeywordPublicInterface ||
     currentProcessingState == ProcessingKeywordLinkInterface)
    ? cmTarget::KeywordTLLSignature
    : cmTarget::PlainTLLSignature;
  if (!this->Target->PushTLLCommandTrace(
        sig, this->Makefile.GetBacktrace().Top())) {
    std::ostringstream e;
    const char* modal = nullptr;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile.GetPolicyStatus(cmPolicies::CMP0023)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0023) << "\n";
        modal = "should";
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = MessageType::FATAL_ERROR;
        break;
    }

    if (modal) {
      // If the sig is a keyword form and there is a conflict, the existing
      // form must be the plain form.
      const char* existingSig =
        (sig == cmTarget::KeywordTLLSignature ? "plain" : "keyword");
      e << "The " << existingSig
        << " signature for target_link_libraries has "
           "already been used with the target \""
        << this->Target->GetName()
        << "\".  All uses of target_link_libraries with a target " << modal
        << " be either all-keyword or all-plain.\n";
      this->Target->GetTllSignatureTraces(e,
                                          sig == cmTarget::KeywordTLLSignature
                                            ? cmTarget::PlainTLLSignature
                                            : cmTarget::KeywordTLLSignature);
      this->Makefile.IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  // Handle normal case where the command was called with another keyword than
  // INTERFACE / LINK_INTERFACE_LIBRARIES or none at all. (The "LINK_LIBRARIES"
  // property of the target on the LHS shall be populated.)
  if (currentProcessingState != ProcessingKeywordLinkInterface &&
      currentProcessingState != ProcessingPlainLinkInterface) {

    if (this->RejectRemoteLinking) {
      this->Makefile.IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("Attempt to add link library \"", lib, "\" to target \"",
                 this->Target->GetName(),
                 "\" which is not built in this "
                 "directory.\nThis is allowed only when policy CMP0079 "
                 "is set to NEW."));
      return false;
    }

    cmTarget* tgt = this->Makefile.GetGlobalGenerator()->FindTarget(lib);

    if (tgt && (tgt->GetType() != cmStateEnums::STATIC_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::UNKNOWN_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::OBJECT_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::INTERFACE_LIBRARY) &&
        !tgt->IsExecutableWithExports()) {
      this->Makefile.IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(
          "Target \"", lib, "\" of type ",
          cmState::GetTargetTypeName(tgt->GetType()),
          " may not be linked into another target. One may link only to "
          "INTERFACE, OBJECT, STATIC or SHARED libraries, or to ",
          "executables with the ENABLE_EXPORTS property set."));
    }

    this->AffectsProperty("LINK_LIBRARIES");
    this->Target->AddLinkLibrary(this->Makefile, lib, llt);
  }

  if (this->WarnRemoteInterface) {
    this->Makefile.IssueMessage(
      MessageType::AUTHOR_WARNING,
      cmStrCat(
        cmPolicies::GetPolicyWarning(cmPolicies::CMP0079), "\nTarget\n  ",
        this->Target->GetName(),
        "\nis not created in this "
        "directory.  For compatibility with older versions of CMake, link "
        "library\n  ",
        lib,
        "\nwill be looked up in the directory in which "
        "the target was created rather than in this calling directory."));
  }

  // Handle (additional) case where the command was called with PRIVATE /
  // LINK_PRIVATE and stop its processing. (The "INTERFACE_LINK_LIBRARIES"
  // property of the target on the LHS shall only be populated if it is a
  // STATIC library.)
  if (currentProcessingState == ProcessingKeywordPrivateInterface ||
      currentProcessingState == ProcessingPlainPrivateInterface) {
    if (this->Target->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->Target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      // TODO: Detect and no-op `$<COMPILE_ONLY>` genexes here.
      std::string configLib =
        this->Target->GetDebugGeneratorExpressions(lib, llt);
      if (cmGeneratorExpression::IsValidTargetName(lib) ||
          cmGeneratorExpression::Find(lib) != std::string::npos) {
        configLib = "$<LINK_ONLY:" + configLib + ">";
      }
      this->AppendProperty("INTERFACE_LINK_LIBRARIES", configLib);
    }
    return true;
  }

  // Handle general case where the command was called with another keyword than
  // PRIVATE / LINK_PRIVATE or none at all. (The "INTERFACE_LINK_LIBRARIES"
  // property of the target on the LHS shall be populated.)
  this->AppendProperty("INTERFACE_LINK_LIBRARIES",
                       this->Target->GetDebugGeneratorExpressions(lib, llt));

  // Stop processing if called without any keyword.
  if (currentProcessingState == ProcessingLinkLibraries) {
    return true;
  }
  // Stop processing if policy CMP0022 is set to NEW.
  const cmPolicies::PolicyStatus policy22Status =
    this->Target->GetPolicyStatusCMP0022();
  if (policy22Status != cmPolicies::OLD &&
      policy22Status != cmPolicies::WARN) {
    return true;
  }
  // Stop processing if called with an INTERFACE library on the LHS.
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return true;
  }

  // Handle (additional) backward-compatibility case where the command was
  // called with PUBLIC / INTERFACE / LINK_PUBLIC / LINK_INTERFACE_LIBRARIES.
  // (The policy CMP0022 is not set to NEW.)
  {
    // Get the list of configurations considered to be DEBUG.
    std::vector<std::string> debugConfigs =
      this->Makefile.GetCMakeInstance()->GetDebugConfigs();
    std::string prop;

    // Include this library in the link interface for the target.
    if (llt == DEBUG_LibraryType || llt == GENERAL_LibraryType) {
      // Put in the DEBUG configuration interfaces.
      for (std::string const& dc : debugConfigs) {
        prop = cmStrCat("LINK_INTERFACE_LIBRARIES_", dc);
        this->AppendProperty(prop, lib);
      }
    }
    if (llt == OPTIMIZED_LibraryType || llt == GENERAL_LibraryType) {
      // Put in the non-DEBUG configuration interfaces.
      this->AppendProperty("LINK_INTERFACE_LIBRARIES", lib);

      // Make sure the DEBUG configuration interfaces exist so that the
      // general one will not be used as a fall-back.
      for (std::string const& dc : debugConfigs) {
        prop = cmStrCat("LINK_INTERFACE_LIBRARIES_", dc);
        if (!this->Target->GetProperty(prop)) {
          this->Target->SetProperty(prop, "");
        }
      }
    }
  }
  return true;
}